

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O3

uint64_t __thiscall
RandomMixin<FastRandomContext>::randbits<32>(RandomMixin<FastRandomContext> *this)

{
  long lVar1;
  ulong uVar2;
  uint64_t uVar3;
  int iVar4;
  ulong uVar5;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->bitbuf_size < 0x20) {
    uVar3 = FastRandomContext::rand64((FastRandomContext *)this);
    uVar5 = uVar3 << ((byte)this->bitbuf_size & 0x3f) | this->bitbuf;
    iVar4 = this->bitbuf_size + 0x20;
    uVar2 = uVar3 >> (-(char)iVar4 & 0x3fU);
  }
  else {
    uVar5 = this->bitbuf;
    uVar2 = uVar5 >> 0x20;
    iVar4 = this->bitbuf_size + -0x20;
  }
  this->bitbuf = uVar2;
  this->bitbuf_size = iVar4;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return uVar5 & 0xffffffff;
  }
  __stack_chk_fail();
}

Assistant:

uint64_t randbits() noexcept
    {
        static_assert(Bits >= 0 && Bits <= 64);
        if constexpr (Bits == 64) {
            return Impl().rand64();
        } else {
            uint64_t ret;
            if (Bits <= bitbuf_size) {
                ret = bitbuf;
                bitbuf >>= Bits;
                bitbuf_size -= Bits;
            } else {
                uint64_t gen = Impl().rand64();
                ret = (gen << bitbuf_size) | bitbuf;
                bitbuf = gen >> (Bits - bitbuf_size);
                bitbuf_size = 64 + bitbuf_size - Bits;
            }
            constexpr uint64_t MASK = (uint64_t{1} << Bits) - 1;
            return ret & MASK;
        }
    }